

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vslv_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  uint local_38;
  uint size;
  uint bytes;
  uint shift;
  int i;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  for (bytes = 0; bytes < 0x10; bytes = bytes + 1) {
    if (bytes + 1 < 0x10) {
      local_38 = (uint)a->u8[(int)(0xf - (bytes + 1))];
    }
    else {
      local_38 = 0;
    }
    r->u8[(int)(0xf - bytes)] =
         (uint8_t)(((uint)a->u8[(int)(0xf - bytes)] * 0x100 + local_38 <<
                   (b->u8[(int)(0xf - bytes)] & 7)) >> 8);
  }
  return;
}

Assistant:

void helper_vslv(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i;
    unsigned int shift, bytes, size;

    size = ARRAY_SIZE(r->u8);
    for (i = 0; i < size; i++) {
        shift = b->VsrB(i) & 0x7;             /* extract shift value */
        bytes = (a->VsrB(i) << 8) +           /* extract adjacent bytes */
            (((i + 1) < size) ? a->VsrB(i + 1) : 0);
        r->VsrB(i) = (bytes << shift) >> 8;   /* shift and store result */
    }
}